

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_23::BinaryReader::ReadType(BinaryReader *this,Type *out_value,char *desc)

{
  bool bVar1;
  Type local_34;
  Enum local_30;
  uint32_t local_2c;
  char *pcStack_28;
  uint32_t type;
  char *desc_local;
  Type *out_value_local;
  BinaryReader *this_local;
  
  local_2c = 0;
  pcStack_28 = desc;
  desc_local = (char *)out_value;
  out_value_local = (Type *)this;
  local_30 = (Enum)ReadS32Leb128(this,&local_2c,desc);
  bVar1 = Failed((Result)local_30);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    Type::Type(&local_34,local_2c);
    *(Enum *)desc_local = local_34.enum_;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadType(Type* out_value, const char* desc) {
  uint32_t type = 0;
  CHECK_RESULT(ReadS32Leb128(&type, desc));
  *out_value = static_cast<Type>(type);
  return Result::Ok;
}